

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeAddedConstants.cpp
# Opt level: O0

bool __thiscall
wasm::MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store>::tryToOptimizeConstant
          (MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store> *this,
          Expression *oneSide,Expression *otherSide)

{
  bool bVar1;
  Result RVar2;
  Literal local_58;
  byte local_40;
  Result result;
  Const *c;
  Expression *otherSide_local;
  Expression *oneSide_local;
  MemoryAccessOptimizer<wasm::OptimizeAddedConstants,_wasm::Store> *this_local;
  
  result.total.addr = (address64_t)Expression::dynCast<wasm::Const>(oneSide);
  if ((Const *)result.total.addr != (Const *)0x0) {
    wasm::Literal::Literal(&local_58,&((Const *)result.total.addr)->value);
    RVar2 = canOptimizeConstant(this,&local_58);
    result._0_8_ = RVar2.total.addr;
    local_40 = RVar2.succeeded;
    wasm::Literal::~Literal(&local_58);
    if ((local_40 & 1) != 0) {
      (this->curr->offset).addr = result._0_8_;
      this->curr->ptr = otherSide;
      bVar1 = Expression::is<wasm::Const>(this->curr->ptr);
      if (bVar1) {
        optimizeConstantPointer(this);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool tryToOptimizeConstant(Expression* oneSide, Expression* otherSide) {
    if (auto* c = oneSide->dynCast<Const>()) {
      auto result = canOptimizeConstant(c->value);
      if (result.succeeded) {
        curr->offset = result.total;
        curr->ptr = otherSide;
        if (curr->ptr->template is<Const>()) {
          optimizeConstantPointer();
        }
        return true;
      }
    }
    return false;
  }